

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::SubroutineIndexMultUniforms::Run(SubroutineIndexMultUniforms *this)

{
  UniformValueGenerator *generator;
  pointer pcVar1;
  long lVar2;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st1;
  SubroutineFunctionSet functions_st0;
  undefined1 local_188 [24];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  pointer local_138;
  pointer local_128;
  undefined1 local_118 [216];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,0);
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)local_188,generator,(Index)ZEXT812(1));
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)local_188);
  pcVar1 = local_118 + 0x88;
  if ((pointer)local_118._120_8_ != pcVar1) {
    operator_delete((void *)local_118._120_8_,local_118._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_188 + 0x10));
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)local_188,generator,(Index)ZEXT812(3));
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)local_188);
  if ((pointer)local_118._120_8_ != pcVar1) {
    operator_delete((void *)local_118._120_8_,local_118._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_188 + 0x10));
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st1,generator,0);
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)local_188,generator,(Index)ZEXT812(2));
  SubroutineFunctionSet::push_back(&functions_st1,(SubroutineFunction *)local_188);
  if ((pointer)local_118._120_8_ != pcVar1) {
    operator_delete((void *)local_118._120_8_,local_118._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_188 + 0x10));
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)local_188,generator,(Index)ZEXT812(0));
  SubroutineFunctionSet::push_back(&functions_st1,(SubroutineFunction *)local_188);
  if ((pointer)local_118._120_8_ != pcVar1) {
    operator_delete((void *)local_118._120_8_,local_118._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_188 + 0x10));
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubroutineUniform::SubroutineUniform
            ((SubroutineUniform *)local_188,generator,&functions_st0,(Loc)ZEXT812(1),0,
             (DefOccurence)0x2,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  UniformValue::~UniformValue((UniformValue *)local_118);
  if (local_138 != (pointer)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != local_160) {
    operator_delete(local_170._M_p,local_160[0]._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_188);
  SubroutineUniform::SubroutineUniform
            ((SubroutineUniform *)local_188,generator,&functions_st1,(Loc)ZEXT812(9),0,
             (DefOccurence)0x2,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  UniformValue::~UniformValue((UniformValue *)local_118);
  if (local_138 != (pointer)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != local_160) {
    operator_delete(local_170._M_p,local_160[0]._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_188);
  lVar2 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector(&subroutineUniforms);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)functions_st1.typeName._M_dataplus._M_p != &functions_st1.typeName.field_2) {
    operator_delete(functions_st1.typeName._M_dataplus._M_p,
                    functions_st1.typeName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector(&functions_st1.fn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)functions_st0.typeName._M_dataplus._M_p != &functions_st0.typeName.field_2) {
    operator_delete(functions_st0.typeName._M_dataplus._M_p,
                    functions_st0.typeName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector(&functions_st0.fn);
  return lVar2;
}

Assistant:

virtual long Run()
	{

		//one shader:

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = 1) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(1)));
		//layout(index = 3) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(3)));

		//subroutine vec4 st1(float param);
		SubroutineFunctionSet functions_st1(uniformValueGenerator);
		//layout(index = 2) subroutine(st1) vec4 sf2(float param) { .... };
		functions_st1.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));
		//layout(index = 0) subroutine(st1) vec4 sf3(float param) { .... };
		functions_st1.push_back(SubroutineFunction(uniformValueGenerator, Index::C(0)));

		std::vector<SubroutineUniform> subroutineUniforms;
		//layout(location = 1) subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 0, DefOccurence::FSH_OR_CSH));
		//layout(location = 9) subroutine uniform st1 u1;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st1, Loc::C(9), 0, DefOccurence::FSH_OR_CSH));

		return doRun(subroutineUniforms);
	}